

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseValueTypeList
          (WastParser *this,TypeVector *out_type_list,ReferenceVars *type_vars)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  TokenType TVar4;
  Result RVar5;
  Var type;
  undefined1 local_110 [8];
  Var local_108;
  Var local_c0;
  Var local_78;
  
  do {
    if (((((this->options_->features).function_references_enabled_ == false) &&
         ((this->options_->features).exceptions_enabled_ != true)) ||
        (bVar3 = PeekMatchLpar(this,Ref), !bVar3)) && (TVar4 = Peek(this,0), TVar4 != First_Type)) {
      return (Result)Ok;
    }
    Var::Var(&local_c0);
    RVar5 = ParseValueType(this,&local_c0);
    if (RVar5.enum_ == Error) {
      Var::~Var(&local_c0);
      return (Result)Error;
    }
    if (local_c0.type_ == Name) {
      if ((this->options_->features).function_references_enabled_ == false) {
        __assert_fail("options_->features.function_references_enabled()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0x3b4,
                      "Result wabt::WastParser::ParseValueTypeList(TypeVector *, ReferenceVars *)");
      }
      pTVar1 = (out_type_list->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pTVar2 = (out_type_list->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Var::Var(&local_78,&local_c0);
      local_110._0_4_ = (Enum)((ulong)((long)pTVar1 - (long)pTVar2) >> 3);
      Var::Var(&local_108,&local_78);
      std::vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
      emplace_back<wabt::WastParser::ReferenceVar>(type_vars,(ReferenceVar *)local_110);
      Var::~Var(&local_108);
      Var::~Var(&local_78);
      local_110._0_4_ = Reference;
      local_110._4_4_ = 0xffffffff;
    }
    else {
      if (local_c0.type_ != Index) {
        __assert_fail("type.is_name()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0x3b3,
                      "Result wabt::WastParser::ParseValueTypeList(TypeVector *, ReferenceVars *)");
      }
      if (local_c0.field_2.index_ < 0xffffffc0) {
        local_110._4_4_ = local_c0.field_2.index_;
        local_110._0_4_ = Reference;
      }
      else {
        local_110._4_4_ = 0;
        local_110._0_4_ = local_c0.field_2.index_;
        if (local_c0.field_2.index_ == 0xffffffeb) {
          __assert_fail("!EnumIsReferenceWithIndex(enum_)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/type.h"
                        ,0x40,"wabt::Type::Type(int32_t)");
        }
      }
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
              (out_type_list,(Type *)local_110);
    Var::~Var(&local_c0);
  } while (RVar5.enum_ != Error);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseValueTypeList(TypeVector* out_type_list,
                                      ReferenceVars* type_vars) {
  WABT_TRACE(ParseValueTypeList);
  while (true) {
    if (!PeekMatchRefType() && !PeekMatch(TokenType::ValueType)) {
      break;
    }

    Var type;
    CHECK_RESULT(ParseValueType(&type));

    if (type.is_index()) {
      // TODO: Incorrect values can be misinterpreted by the parser.
      if (type.index() >= static_cast<Index>(Type::Void)) {
        out_type_list->push_back(Type(type.index()));
      } else {
        out_type_list->push_back(Type(Type::Reference, type.index()));
      }
    } else {
      assert(type.is_name());
      assert(options_->features.function_references_enabled());
      type_vars->push_back(ReferenceVar(out_type_list->size(), type));
      out_type_list->push_back(Type(Type::Reference, kInvalidIndex));
    }
  }

  return Result::Ok;
}